

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

string * booster::locale::time_zone::global(string *__return_storage_ptr__,string *new_id)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&tz_mutex::m);
  tz_id_abi_cxx11_();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&tz_id[abi:cxx11]()::id_abi_cxx11_);
  tz_id_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&tz_id[abi:cxx11]()::id_abi_cxx11_);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string global(std::string const &new_id)
    {
        booster::unique_lock<booster::mutex> lock(tz_mutex());
        std::string id = tz_id();
        tz_id() = new_id;
        return id;
    }